

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeCurve::Append(ON_PolyEdgeCurve *this,ON_PolyEdgeSegment *new_segment)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  undefined1 local_40 [8];
  ON_Interval sdom;
  ON_Interval cdom;
  bool rc;
  ON_PolyEdgeSegment *new_segment_local;
  ON_PolyEdgeCurve *this_local;
  
  (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x17])();
  cdom.m_t[1]._7_1_ = false;
  if (new_segment != (ON_PolyEdgeSegment *)0x0) {
    iVar2 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    if (0 < iVar2) {
      (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])();
      (*(new_segment->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x25])();
      pdVar3 = ON_Interval::operator[]((ON_Interval *)local_40,0);
      dVar1 = *pdVar3;
      pdVar3 = ON_Interval::operator[]((ON_Interval *)(sdom.m_t + 1),1);
      if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
        pdVar3 = ON_Interval::operator[]((ON_Interval *)(sdom.m_t + 1),1);
        dVar1 = *pdVar3;
        dVar4 = ON_Interval::Length((ON_Interval *)local_40);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_40,1);
        *pdVar3 = dVar1 + dVar4;
        pdVar3 = ON_Interval::operator[]((ON_Interval *)(sdom.m_t + 1),1);
        dVar1 = *pdVar3;
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_40,0);
        *pdVar3 = dVar1;
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_40,0);
        dVar1 = *pdVar3;
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_40,1);
        (*(new_segment->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(dVar1,*pdVar3);
      }
    }
    cdom.m_t[1]._7_1_ = ON_PolyCurve::Append(&this->super_ON_PolyCurve,(ON_Curve *)new_segment);
  }
  return cdom.m_t[1]._7_1_;
}

Assistant:

bool ON_PolyEdgeCurve::Append( ON_PolyEdgeSegment* new_segment )
{
  DestroyRuntimeCache();
  bool rc = false;
  if ( new_segment )
  {
    //m_is_closed_helper = 0;
    if ( Count() > 0 )
    {
      // keep segment domains in synch with polycurve domain
      // so that parameter bookkeeping is easy.
      ON_Interval cdom = Domain();
      ON_Interval sdom = new_segment->Domain();
      if ( sdom[0] != cdom[1] )
      {
        sdom[1] = cdom[1] + sdom.Length();
        sdom[0] = cdom[1];
        new_segment->SetDomain(sdom[0],sdom[1]);
      }
    }
    rc = ON_PolyCurve::Append(new_segment);
  }
  return rc;
}